

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

btSoftBody *
btSoftBodyHelpers::CreatePatch
          (btSoftBodyWorldInfo *worldInfo,btVector3 *corner00,btVector3 *corner10,
          btVector3 *corner01,btVector3 *corner11,int resx,int resy,int fixeds,bool gendiags)

{
  int node2;
  btVector3 *pbVar1;
  btScalar *pbVar2;
  btSoftBody *this;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int node1;
  btSoftBodyWorldInfo *ptr;
  int node1_00;
  int iVar7;
  int ix;
  int iVar8;
  ulong uVar9;
  int node0;
  int iVar10;
  btScalar *pbVar11;
  btScalar *pbVar12;
  bool bVar13;
  btVector3 bVar14;
  btScalar tx;
  btScalar ty;
  ulong local_98;
  btSoftBodyWorldInfo *local_90;
  btScalar *local_88;
  btVector3 *local_80;
  long local_78;
  long local_70;
  ulong local_68;
  btVector3 *local_60;
  btVector3 *local_58;
  btVector3 py1;
  btVector3 py0;
  
  if (resy < 2 || resx < 2) {
    this = (btSoftBody *)0x0;
  }
  else {
    uVar4 = (ulong)(uint)(resy * resx);
    local_90 = worldInfo;
    local_60 = corner00;
    local_58 = corner10;
    pbVar1 = (btVector3 *)btVector3::operator_new__(uVar4 << 4);
    local_98 = uVar4;
    pbVar2 = (btScalar *)operator_new__(uVar4 * 4);
    iVar7 = resy + -1;
    uVar3 = resx - 1;
    uVar6 = (ulong)(uint)resx;
    local_68 = (ulong)(uint)resy;
    local_70 = uVar6 * 4;
    pbVar12 = pbVar1->m_floats + 2;
    local_78 = uVar6 << 4;
    local_88 = pbVar2;
    local_80 = pbVar1;
    for (uVar4 = 0; uVar4 != local_68; uVar4 = uVar4 + 1) {
      ty = (float)(int)uVar4 / (float)iVar7;
      py0 = btVector3::lerp(local_60,corner01,&ty);
      py1 = btVector3::lerp(local_58,corner11,&ty);
      pbVar11 = pbVar12;
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        tx = (float)(int)uVar9 / (float)(int)uVar3;
        bVar14 = btVector3::lerp(&py0,&py1,&tx);
        *&((btVector3 *)(pbVar11 + -2))->m_floats = bVar14.m_floats;
        pbVar2[uVar9] = 1.0;
        pbVar11 = pbVar11 + 4;
      }
      pbVar2 = (btScalar *)((long)pbVar2 + local_70);
      pbVar12 = (btScalar *)((long)pbVar12 + local_78);
    }
    this = (btSoftBody *)btCollisionObject::operator_new(0x690);
    pbVar1 = local_80;
    pbVar2 = local_88;
    ptr = local_90;
    btSoftBody::btSoftBody(this,local_90,(int)local_98,local_80,local_88);
    if ((fixeds & 1U) != 0) {
      ptr = (btSoftBodyWorldInfo *)0x0;
      btSoftBody::setMass(this,0,0.0);
    }
    if ((fixeds & 2U) != 0) {
      ptr = (btSoftBodyWorldInfo *)(ulong)uVar3;
      btSoftBody::setMass(this,uVar3,0.0);
    }
    if ((fixeds & 4U) != 0) {
      ptr = (btSoftBodyWorldInfo *)(ulong)(uint)(iVar7 * resx);
      btSoftBody::setMass(this,iVar7 * resx,0.0);
    }
    if ((fixeds & 8U) != 0) {
      uVar3 = uVar3 + iVar7 * resx;
      ptr = (btSoftBodyWorldInfo *)(ulong)uVar3;
      btSoftBody::setMass(this,uVar3,0.0);
    }
    if (pbVar1 != (btVector3 *)0x0) {
      btVector3::operator_delete__(pbVar1,ptr);
    }
    operator_delete__(pbVar2);
    iVar10 = 0;
    iVar7 = 0;
    while (iVar7 != resy) {
      iVar8 = 1;
      iVar5 = resx;
      node0 = iVar10;
      while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
        if (iVar8 < resx) {
          btSoftBody::appendLink(this,node0,node0 + 1,(Material *)0x0,false);
        }
        if (iVar7 + 1 < resy) {
          node1 = resx + node0;
          btSoftBody::appendLink(this,node0,node1,(Material *)0x0,false);
          if (iVar8 < resx) {
            node1_00 = node0 + 1;
            if (((iVar7 + iVar8) - 1U & 1) == 0) {
              btSoftBody::appendFace(this,node1,node0,node1_00,(Material *)0x0);
              btSoftBody::appendFace(this,node1,node1_00,resx + 1 + node0,(Material *)0x0);
            }
            else {
              node2 = resx + 1 + node0;
              btSoftBody::appendFace(this,node0,node1_00,node2,(Material *)0x0);
              btSoftBody::appendFace(this,node0,node2,node1,(Material *)0x0);
              node1 = node2;
              node1_00 = node0;
            }
            if (gendiags) {
              btSoftBody::appendLink(this,node1_00,node1,(Material *)0x0,false);
            }
          }
        }
        node0 = node0 + 1;
        iVar8 = iVar8 + 1;
      }
      iVar10 = iVar10 + resx;
      iVar7 = iVar7 + 1;
    }
  }
  return this;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreatePatch(btSoftBodyWorldInfo& worldInfo,const btVector3& corner00,
											   const btVector3& corner10,
											   const btVector3& corner01,
											   const btVector3& corner11,
											   int resx,
											   int resy,
											   int fixeds,
											   bool gendiags)
{
#define IDX(_x_,_y_)	((_y_)*rx+(_x_))
	/* Create nodes	*/ 
	if((resx<2)||(resy<2)) return(0);
	const int	rx=resx;
	const int	ry=resy;
	const int	tot=rx*ry;
	btVector3*	x=new btVector3[tot];
	btScalar*	m=new btScalar[tot];
	int iy;

	for(iy=0;iy<ry;++iy)
	{
		const btScalar	ty=iy/(btScalar)(ry-1);
		const btVector3	py0=lerp(corner00,corner01,ty);
		const btVector3	py1=lerp(corner10,corner11,ty);
		for(int ix=0;ix<rx;++ix)
		{
			const btScalar	tx=ix/(btScalar)(rx-1);
			x[IDX(ix,iy)]=lerp(py0,py1,tx);
			m[IDX(ix,iy)]=1;
		}
	}
	btSoftBody*		psb=new btSoftBody(&worldInfo,tot,x,m);
	if(fixeds&1)	psb->setMass(IDX(0,0),0);
	if(fixeds&2)	psb->setMass(IDX(rx-1,0),0);
	if(fixeds&4)	psb->setMass(IDX(0,ry-1),0);
	if(fixeds&8)	psb->setMass(IDX(rx-1,ry-1),0);
	delete[] x;
	delete[] m;
	/* Create links	and faces */ 
	for(iy=0;iy<ry;++iy)
	{
		for(int ix=0;ix<rx;++ix)
		{
			const int	idx=IDX(ix,iy);
			const bool	mdx=(ix+1)<rx;
			const bool	mdy=(iy+1)<ry;
			if(mdx) psb->appendLink(idx,IDX(ix+1,iy));
			if(mdy) psb->appendLink(idx,IDX(ix,iy+1));
			if(mdx&&mdy)
			{
				if((ix+iy)&1)
				{
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy),IDX(ix+1,iy+1));
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy+1),IDX(ix,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix,iy),IDX(ix+1,iy+1));
					}
				}
				else
				{
					psb->appendFace(IDX(ix,iy+1),IDX(ix,iy),IDX(ix+1,iy));
					psb->appendFace(IDX(ix,iy+1),IDX(ix+1,iy),IDX(ix+1,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix+1,iy),IDX(ix,iy+1));
					}
				}
			}
		}
	}
	/* Finished		*/ 
#undef IDX
	return(psb);
}